

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O2

void __thiscall Assimp::LWO::Surface::Surface(Surface *this,Surface *param_1)

{
  undefined3 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  (this->mColor).r = (param_1->mColor).r;
  (this->mColor).g = (param_1->mColor).g;
  (this->mColor).b = (param_1->mColor).b;
  uVar1 = *(undefined3 *)&param_1->field_0x2d;
  fVar2 = param_1->mDiffuseValue;
  fVar3 = param_1->mSpecularValue;
  fVar4 = param_1->mTransparency;
  fVar5 = param_1->mGlossiness;
  fVar6 = param_1->mLuminosity;
  fVar7 = param_1->mColorHighlights;
  fVar8 = param_1->mMaximumSmoothAngle;
  this->bDoubleSided = param_1->bDoubleSided;
  *(undefined3 *)&this->field_0x2d = uVar1;
  this->mDiffuseValue = fVar2;
  this->mSpecularValue = fVar3;
  this->mTransparency = fVar4;
  this->mGlossiness = fVar5;
  this->mLuminosity = fVar6;
  this->mColorHighlights = fVar7;
  this->mMaximumSmoothAngle = fVar8;
  std::__cxx11::string::string((string *)&this->mVCMap,(string *)&param_1->mVCMap);
  this->mVCMapType = param_1->mVCMapType;
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->mShaders,(_List_node_header *)&param_1->mShaders);
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->mColorTextures,
             (_List_node_header *)&param_1->mColorTextures);
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->mDiffuseTextures,
             (_List_node_header *)&param_1->mDiffuseTextures);
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->mSpecularTextures,
             (_List_node_header *)&param_1->mSpecularTextures);
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->mOpacityTextures,
             (_List_node_header *)&param_1->mOpacityTextures);
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->mBumpTextures,(_List_node_header *)&param_1->mBumpTextures)
  ;
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->mGlossinessTextures,
             (_List_node_header *)&param_1->mGlossinessTextures);
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->mReflectionTextures,
             (_List_node_header *)&param_1->mReflectionTextures);
  fVar2 = param_1->mBumpIntensity;
  bVar9 = param_1->mWireframe;
  uVar1 = *(undefined3 *)&param_1->field_0x141;
  fVar3 = param_1->mAdditiveTransparency;
  this->mIOR = param_1->mIOR;
  this->mBumpIntensity = fVar2;
  this->mWireframe = bVar9;
  *(undefined3 *)&this->field_0x141 = uVar1;
  this->mAdditiveTransparency = fVar3;
  return;
}

Assistant:

Surface()
        : mColor                (0.78431f,0.78431f,0.78431f)
        , bDoubleSided          (false)
        , mDiffuseValue         (1.f)
        , mSpecularValue        (0.f)
        , mTransparency         (0.f)
        , mGlossiness           (0.4f)
        , mLuminosity           (0.f)
        , mColorHighlights      (0.f)
        , mMaximumSmoothAngle   (0.f) // 0 == not specified, no smoothing
        , mVCMap                ("")
        , mVCMapType            (AI_LWO_RGBA)
        , mIOR                  (1.f) // vakuum
        , mBumpIntensity        (1.f)
        , mWireframe            (false)
        , mAdditiveTransparency (0.f)
    {}